

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O3

int get_seg_physical_address
              (CPUMIPSState_conflict5 *env,hwaddr *physical,int *prot,target_ulong real_address,
              int rw,int access_type,int mmu_idx,uint am,_Bool eu,target_ulong segmask,
              hwaddr physical_base)

{
  int iVar1;
  undefined7 in_stack_00000019;
  
  if (3 < (uint)access_type) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/mips/helper.c"
                  ,0xaa,"int is_seg_am_mapped(unsigned int, _Bool, int)");
  }
  iVar1 = 0x70000000;
  switch(access_type) {
  case 0:
    goto switchD_009573bf_caseD_0;
  case 1:
    iVar1 = -0x3fc80000;
    break;
  case 2:
    iVar1 = -0x1be80000;
    break;
  case 3:
    if ((char)am == '\0') goto switchD_009573bf_caseD_0;
    goto LAB_009573eb;
  }
  if (iVar1 << ((byte)mmu_idx & 0x1f) < 0) {
    iVar1 = -1;
  }
  else {
    iVar1 = iVar1 << 8;
switchD_009573bf_caseD_0:
    if (iVar1 << ((byte)mmu_idx & 0x1f) < 0) {
      iVar1 = (*env->tlb->map_address)(env,physical,prot,real_address,rw,0x20);
      return iVar1;
    }
LAB_009573eb:
    *physical = CONCAT71(in_stack_00000019,eu) & real_address | segmask;
    *prot = 7;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int is_seg_am_mapped(unsigned int am, bool eu, int mmu_idx)
{
    /*
     * Interpret access control mode and mmu_idx.
     *           AdE?     TLB?
     *      AM  K S U E  K S U E
     * UK    0  0 1 1 0  0 - - 0
     * MK    1  0 1 1 0  1 - - !eu
     * MSK   2  0 0 1 0  1 1 - !eu
     * MUSK  3  0 0 0 0  1 1 1 !eu
     * MUSUK 4  0 0 0 0  0 1 1 0
     * USK   5  0 0 1 0  0 0 - 0
     * -     6  - - - -  - - - -
     * UUSK  7  0 0 0 0  0 0 0 0
     */
    int32_t adetlb_mask;

    switch (mmu_idx) {
    case 3: /* ERL */
        /* If EU is set, always unmapped */
        if (eu) {
            return 0;
        }
        /* fall through */
    case MIPS_HFLAG_KM:
        /* Never AdE, TLB mapped if AM={1,2,3} */
        adetlb_mask = 0x70000000;
        goto check_tlb;

    case MIPS_HFLAG_SM:
        /* AdE if AM={0,1}, TLB mapped if AM={2,3,4} */
        adetlb_mask = 0xc0380000;
        goto check_ade;

    case MIPS_HFLAG_UM:
        /* AdE if AM={0,1,2,5}, TLB mapped if AM={3,4} */
        adetlb_mask = 0xe4180000;
        /* fall through */
    check_ade:
        /* does this AM cause AdE in current execution mode */
        if ((adetlb_mask << am) < 0) {
            return TLBRET_BADADDR;
        }
        adetlb_mask <<= 8;
        /* fall through */
    check_tlb:
        /* is this AM mapped in current execution mode */
        return ((adetlb_mask << am) < 0);
    default:
        assert(0);
        return TLBRET_BADADDR;
    };
}